

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_utf_decode(char *c,nk_rune *u,int clen)

{
  uint i;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  nk_rune nVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  
  if (c == (char *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x142f,"int nk_utf_decode(const char *, nk_rune *, int)");
  }
  if (u == (nk_rune *)0x0) {
    __assert_fail("u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x1430,"int nk_utf_decode(const char *, nk_rune *, int)");
  }
  if (clen != 0) {
    *u = 0xfffd;
    uVar3 = 0;
    do {
      if ((nk_utfmask[uVar3] & *c) == nk_utfbyte[uVar3]) {
        nVar4 = (nk_rune)(byte)(*c & ~nk_utfmask[uVar3]);
        goto LAB_00119473;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != 5);
    nVar4 = 0;
    uVar3 = 5;
LAB_00119473:
    i = (uint)uVar3;
    uVar1 = 1;
    if (3 < i - 1) goto LAB_00119507;
    bVar7 = 1 < (int)i;
    if (1 < (int)i && 1 < clen) {
      uVar2 = clen - 2U;
      if (i - 2 < clen - 2U) {
        uVar2 = i - 2;
      }
      uVar1 = 1;
      do {
        lVar6 = 0;
        do {
          if ((nk_utfmask[lVar6] & c[uVar1]) == nk_utfbyte[lVar6]) {
            uVar5 = (uint)(byte)(c[uVar1] & ~nk_utfmask[lVar6]);
            bVar7 = lVar6 == 0;
            goto LAB_001194e8;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 5);
        bVar7 = false;
        uVar5 = 0;
LAB_001194e8:
        if (!bVar7) goto LAB_00119507;
        nVar4 = nVar4 << 6 | uVar5;
        uVar1 = uVar1 + 1;
      } while (uVar1 != uVar2 + 2);
      bVar7 = (uint)uVar1 < i;
    }
    if (!bVar7) {
      *u = nVar4;
      nk_utf_validate(u,i);
      uVar1 = uVar3 & 0xffffffff;
      goto LAB_00119507;
    }
  }
  uVar1 = 0;
LAB_00119507:
  return (int)uVar1;
}

Assistant:

NK_API int
nk_utf_decode(const char *c, nk_rune *u, int clen)
{
    int i, j, len, type=0;
    nk_rune udecoded;

    NK_ASSERT(c);
    NK_ASSERT(u);

    if (!c || !u) return 0;
    if (!clen) return 0;
    *u = NK_UTF_INVALID;

    udecoded = nk_utf_decode_byte(c[0], &len);
    if (!NK_BETWEEN(len, 1, NK_UTF_SIZE))
        return 1;

    for (i = 1, j = 1; i < clen && j < len; ++i, ++j) {
        udecoded = (udecoded << 6) | nk_utf_decode_byte(c[i], &type);
        if (type != 0)
            return j;
    }
    if (j < len)
        return 0;
    *u = udecoded;
    nk_utf_validate(u, len);
    return len;
}